

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.cc
# Opt level: O2

float GEN_CS::safe_probability(float prob)

{
  ostream *poVar1;
  
  if (prob <= 0.0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Probability ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,prob);
    poVar1 = std::operator<<(poVar1," is not possible, replacing with 1e-3.  Fix your dataset. ");
    std::endl<char,std::char_traits<char>>(poVar1);
    prob = 0.001;
  }
  return prob;
}

Assistant:

float safe_probability(float prob)
{
  if (prob <= 0.)
  {
    std::cout << "Probability " << prob << " is not possible, replacing with 1e-3.  Fix your dataset. " << std::endl;
    return 1e-3f;
  }
  else
    return prob;
}